

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_schema.hpp
# Opt level: O1

void __thiscall duckdb::CSVSchema::~CSVSchema(CSVSchema *this)

{
  pointer pcVar1;
  
  pcVar1 = (this->file_path)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->file_path).field_2) {
    operator_delete(pcVar1);
  }
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->name_idx_map)._M_h);
  ::std::vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_>::~vector
            ((vector<duckdb::CSVColumnInfo,_std::allocator<duckdb::CSVColumnInfo>_> *)this);
  return;
}

Assistant:

explicit CSVSchema(const bool empty = false) : empty(empty) {
	}